

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_micro.c
# Opt level: O0

void * worker_thread_put(void *arg)

{
  FILE *__stream;
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  double dVar4;
  undefined1 local_58 [8];
  benchmark_time_t tdiff;
  benchmark_time_t t2;
  benchmark_time_t t1;
  unsigned_long_long shift;
  unsigned_long_long i;
  context *ctx;
  void *arg_local;
  
  uVar2 = (ulong)(uint)(*arg * *(int *)((long)arg + 0x1c));
  i = (unsigned_long_long)arg;
  ctx = (context *)arg;
  benchmark_time_get((benchmark_time_t *)&t2.tv_nsec);
  shift = uVar2;
  while( true ) {
    if (uVar2 + *(uint *)(i + 0x1c) <= shift) {
      benchmark_time_get((benchmark_time_t *)&tdiff.tv_nsec);
      benchmark_time_diff((benchmark_time_t *)local_58,(benchmark_time_t *)&t2.tv_nsec,
                          (benchmark_time_t *)&tdiff.tv_nsec);
      dVar4 = benchmark_time_get_secs((benchmark_time_t *)local_58);
      *(double *)(i + 0x20) = dVar4;
      return (void *)0x0;
    }
    iVar1 = vmemcache_put(*(undefined8 *)(i + 8),&shift,8,
                          *(undefined8 *)
                           (*(long *)(i + 0x10) + (shift % (ulong)*(uint *)(i + 0x18)) * 0x10 + 8),
                          *(undefined8 *)
                           (*(long *)(i + 0x10) + (shift % (ulong)*(uint *)(i + 0x18)) * 0x10));
    if (iVar1 != 0) break;
    shift = shift + 1;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_micro.c"
          ,0x5a,"worker_thread_put");
  __stream = _stderr;
  uVar3 = vmemcache_errormsg();
  fprintf(__stream,"ERROR: vmemcache_put: %s",uVar3);
  fprintf(_stderr,"\n");
  abort();
}

Assistant:

static void *
worker_thread_put(void *arg)
{
	struct context *ctx = arg;
	unsigned long long i;
	unsigned long long shift = ctx->thread_number * ctx->ops_count;
	benchmark_time_t t1, t2, tdiff;

	benchmark_time_get(&t1);

	for (i = shift; i < (shift + ctx->ops_count); i++) {
		if (vmemcache_put(ctx->cache, &i, sizeof(i),
				ctx->buffs[i % ctx->nbuffs].buff,
				ctx->buffs[i % ctx->nbuffs].size))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
	}

	benchmark_time_get(&t2);
	benchmark_time_diff(&tdiff, &t1, &t2);
	ctx->secs = benchmark_time_get_secs(&tdiff);

	return NULL;
}